

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  ostream *poVar2;
  double dVar3;
  string line;
  ExpressionTree et;
  string local_1c8;
  ExpressionTree local_1a8;
  
  expression_test();
  calculator::ExpressionTree::ExpressionTree(&local_1a8);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  while (*(int *)(_ITM_registerTMCloneTable + *(long *)(std::cin + -0x18)) == 0) {
    std::operator<<((ostream *)&std::cout,">>> ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_1c8);
    if (local_1c8._M_string_length != 0) {
      dVar3 = calculator::ExpressionTree::calcExpression(&local_1a8,&local_1c8);
      lVar1 = std::cout;
      *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 10;
      *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) =
           *(uint *)(std::__cxx11::string::string + *(long *)(lVar1 + -0x18)) & 0xfffffefb | 4;
      std::operator<<((ostream *)&std::cout,"=> ");
      poVar2 = std::ostream::_M_insert<double>(dVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  calculator::ExpressionTree::~ExpressionTree(&local_1a8);
  return 0;
}

Assistant:

int main() {
    expression_test();
    ExpressionTree et;
    string line;
    while (cin.good()) {
        cout << ">>> ";
        getline(cin, line);
        if (line.empty()) continue;
        try {
            double x = et.calcExpression(line);
            cout.precision(10);
            cout << fixed << "=> " << x << endl;
        } catch (SyntaxError &e) {
            cout << e.what() << endl;
            cin.ignore();
            cin.clear();
        }
    }
    return 0;
}